

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checkbox.cpp
# Opt level: O3

void __thiscall cursespp::Checkbox::Checkbox(Checkbox *this,string *value)

{
  connections_list *pcVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_40,&UNCHECKED_abi_cxx11_,value);
  TextLabel::TextLabel(&this->super_TextLabel,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->super_TextLabel).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable =
       (_func_int **)&PTR__Checkbox_001a3fd0;
  (this->super_TextLabel).super_Window.super_IWindow.super_IDisplayable._vptr_IDisplayable =
       (_func_int **)&PTR__Checkbox_001a41f0;
  (this->super_TextLabel).super_Window.super_IWindow.super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__Checkbox_001a4220;
  (this->super_TextLabel).super_Window.super_IWindow.super_IMessageTarget._vptr_IMessageTarget =
       (_func_int **)&PTR__Checkbox_001a4248;
  (this->super_TextLabel).super_IKeyHandler._vptr_IKeyHandler =
       (_func_int **)&PTR__Checkbox_001a4270;
  (this->CheckChanged).
  super__signal_base2<cursespp::Checkbox_*,_bool,_sigslot::multi_threaded_local>.
  super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__multi_threaded_local_001a3f28;
  pthread_mutex_init((pthread_mutex_t *)
                     &(this->CheckChanged).
                      super__signal_base2<cursespp::Checkbox_*,_bool,_sigslot::multi_threaded_local>
                      .super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
                      m_mutex,(pthread_mutexattr_t *)0x0);
  pcVar1 = &(this->CheckChanged).
            super__signal_base2<cursespp::Checkbox_*,_bool,_sigslot::multi_threaded_local>.
            m_connected_slots;
  *(connections_list **)
   ((long)&(this->CheckChanged).
           super__signal_base2<cursespp::Checkbox_*,_bool,_sigslot::multi_threaded_local>.
           m_connected_slots.
           super__List_base<sigslot::_connection_base2<cursespp::Checkbox_*,_bool,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base2<cursespp::Checkbox_*,_bool,_sigslot::multi_threaded_local>_*>_>
           ._M_impl._M_node.super__List_node_base + 8) = pcVar1;
  (this->CheckChanged).
  super__signal_base2<cursespp::Checkbox_*,_bool,_sigslot::multi_threaded_local>.m_connected_slots.
  super__List_base<sigslot::_connection_base2<cursespp::Checkbox_*,_bool,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base2<cursespp::Checkbox_*,_bool,_sigslot::multi_threaded_local>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pcVar1;
  (this->CheckChanged).
  super__signal_base2<cursespp::Checkbox_*,_bool,_sigslot::multi_threaded_local>.m_connected_slots.
  super__List_base<sigslot::_connection_base2<cursespp::Checkbox_*,_bool,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base2<cursespp::Checkbox_*,_bool,_sigslot::multi_threaded_local>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->CheckChanged).
  super__signal_base2<cursespp::Checkbox_*,_bool,_sigslot::multi_threaded_local>.
  super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__signal2_001a4388;
  (this->originalText)._M_dataplus._M_p = (pointer)&(this->originalText).field_2;
  pcVar2 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->originalText,pcVar2,pcVar2 + value->_M_string_length);
  return;
}

Assistant:

Checkbox::Checkbox(const std::string& value)
: TextLabel(decorate(value, false))
, originalText(value) {
}